

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O3

bool bssl::ext_ech_add_clienthello
               (SSL_HANDSHAKE *hs,CBB *out,CBB *out_compressible,ssl_client_hello_type_t type)

{
  int iVar1;
  CBB ech_body;
  CBB CStack_48;
  
  if (type == ssl_client_hello_inner) {
    iVar1 = CBB_add_u16(out,0xfe0d);
    if ((iVar1 != 0) && (iVar1 = CBB_add_u16(out,1), iVar1 != 0)) {
      iVar1 = CBB_add_u8(out,'\x01');
LAB_0013b8dd:
      return iVar1 != 0;
    }
  }
  else {
    if ((hs->ech_client_outer).size_ == 0) {
      return true;
    }
    iVar1 = CBB_add_u16(out,0xfe0d);
    if ((iVar1 != 0) && (iVar1 = CBB_add_u16_length_prefixed(out,&CStack_48), iVar1 != 0)) {
      iVar1 = CBB_add_u8(&CStack_48,'\0');
      if (iVar1 == 0) {
        return false;
      }
      iVar1 = CBB_add_bytes(&CStack_48,(hs->ech_client_outer).data_,(hs->ech_client_outer).size_);
      if (iVar1 != 0) {
        iVar1 = CBB_flush(out);
        goto LAB_0013b8dd;
      }
    }
  }
  return false;
}

Assistant:

static bool ext_ech_add_clienthello(const SSL_HANDSHAKE *hs, CBB *out,
                                    CBB *out_compressible,
                                    ssl_client_hello_type_t type) {
  if (type == ssl_client_hello_inner) {
    if (!CBB_add_u16(out, TLSEXT_TYPE_encrypted_client_hello) ||
        !CBB_add_u16(out, /* length */ 1) ||
        !CBB_add_u8(out, ECH_CLIENT_INNER)) {
      return false;
    }
    return true;
  }

  if (hs->ech_client_outer.empty()) {
    return true;
  }

  CBB ech_body;
  if (!CBB_add_u16(out, TLSEXT_TYPE_encrypted_client_hello) ||
      !CBB_add_u16_length_prefixed(out, &ech_body) ||
      !CBB_add_u8(&ech_body, ECH_CLIENT_OUTER) ||
      !CBB_add_bytes(&ech_body, hs->ech_client_outer.data(),
                     hs->ech_client_outer.size()) ||
      !CBB_flush(out)) {
    return false;
  }
  return true;
}